

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O1

void hash_add(adh_node_t *node,hash_entry_t *entry)

{
  hash_entry_t *phVar1;
  hash_entry_t *phVar2;
  uint uVar3;
  
  uVar3 = node->weight % 0x1eef;
  if (entry == (hash_entry_t *)0x0) {
    entry = (hash_entry_t *)calloc(1,0x18);
  }
  entry->value = node;
  phVar1 = map_weight_nodes.buckets[uVar3];
  if (map_weight_nodes.buckets[uVar3] == (hash_entry_t *)0x0) {
    map_weight_nodes.buckets[uVar3] = entry;
  }
  else {
    do {
      phVar2 = phVar1;
      phVar1 = phVar2->next;
    } while (phVar2->next != (hash_entry *)0x0);
    phVar2->next = entry;
    entry->prev = phVar2;
  }
  return;
}

Assistant:

void hash_add(adh_node_t* node, hash_entry_t *entry){
    int hash_index = hash_get_index(node->weight);

    hash_entry_t  *new_entry = entry != NULL ? entry : calloc(1, sizeof(hash_entry_t));
    new_entry->value = node;

    hash_entry_t  *last = map_weight_nodes.buckets[hash_index];
    if(last == NULL) {
        map_weight_nodes.buckets[hash_index] = new_entry;
    }
    else {
        while(last->next) {
            last = last->next;
        }

        last->next = new_entry;
        new_entry->prev = last;
    }
}